

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

Error * ot::commissioner::utils::ParseInteger<int>
                  (Error *__return_storage_ptr__,int *aInteger,string *aStr)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_142;
  v10 local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  char *local_138;
  string local_130;
  Error local_110;
  char *local_e8;
  char *endPtr;
  uint64_t integer;
  string *local_d0;
  string *aStr_local;
  int *aInteger_local;
  Error *error;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  integer._7_1_ = 0;
  local_d0 = aStr;
  aStr_local = (string *)aInteger;
  aInteger_local = (int *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  local_e8 = (char *)0x0;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  endPtr = (char *)strtoull(pcVar1,&local_e8,0);
  pcVar1 = local_e8;
  if (local_e8 != (char *)0x0) {
    lVar2 = std::__cxx11::string::c_str();
    lVar3 = std::__cxx11::string::length();
    if (pcVar1 == (char *)(lVar2 + lVar3)) {
      *(int *)aStr_local = (int)endPtr;
      return __return_storage_ptr__;
    }
  }
  ParseInteger<int>::anon_class_1_0_00000001::operator()(&local_142);
  local_58 = &local_140;
  local_60 = &local_141;
  bVar4 = ::fmt::v10::operator()(local_60);
  local_138 = (char *)bVar4.size_;
  local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4.data_;
  ::fmt::v10::detail::
  check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
            ();
  local_68 = &local_130;
  local_78 = local_140;
  pcStack_70 = local_138;
  local_80 = local_d0;
  local_50 = &local_78;
  local_90 = local_140;
  local_88 = local_138;
  local_48 = local_90;
  pcStack_40 = local_88;
  error = (Error *)::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_d0,(v10 *)local_68,local_140);
  local_30 = local_a0;
  local_38 = &error;
  local_18 = 0xd;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_38;
  fmt.size_ = 0xd;
  fmt.data_ = local_88;
  local_28 = local_38;
  local_20 = local_38;
  local_10 = local_30;
  ::fmt::v10::vformat_abi_cxx11_(&local_130,(v10 *)local_90,fmt,args);
  Error::Error(&local_110,kInvalidArgs,&local_130);
  Error::operator=(__return_storage_ptr__,&local_110);
  Error::~Error(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

Error ParseInteger(T &aInteger, const std::string &aStr)
{
    Error    error;
    uint64_t integer;
    char    *endPtr = nullptr;

    integer = strtoull(aStr.c_str(), &endPtr, 0);

    VerifyOrExit(endPtr != nullptr && endPtr == aStr.c_str() + aStr.length(),
                 error = ERROR_INVALID_ARGS("{} is not a valid integer", aStr));

    aInteger = integer;

exit:
    return error;
}